

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Node::AddValidationOutEdge(Node *this,Edge *edge)

{
  Edge *local_18;
  Edge *edge_local;
  Node *this_local;
  
  local_18 = edge;
  edge_local = (Edge *)this;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->validation_out_edges_,&local_18);
  return;
}

Assistant:

void AddValidationOutEdge(Edge* edge) { validation_out_edges_.push_back(edge); }